

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O0

string * __thiscall
yactfr::internal::EndReadScopeInstr::_toStr_abi_cxx11_
          (string *__return_storage_ptr__,EndReadScopeInstr *this,Size param_1)

{
  ostream *poVar1;
  Scope scope;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream ss;
  Size param_1_local;
  EndReadScopeInstr *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198," ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e8,"scope",&local_1e9);
  _strProp(&local_1c8,&local_1e8);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c8);
  (anonymous_namespace)::scopeStr_abi_cxx11_
            (&local_210,(_anonymous_namespace_ *)(ulong)*(uint *)&(this->super_Instr).field_0xc,
             scope);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string EndReadScopeInstr::_toStr(Size) const
{
    std::ostringstream ss;

    ss << " " << _strProp("scope") << scopeStr(_scope) << std::endl;
    return ss.str();
}